

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testValid_Classifier_PredictedFeatureNameAndTarget(void)

{
  int iVar1;
  Rep *pRVar2;
  void *pvVar3;
  string *psVar4;
  pointer pcVar5;
  bool bVar6;
  ModelDescription *pMVar7;
  Type *pTVar8;
  LogMessage *other;
  CategoricalCrossEntropyLossLayer *pCVar9;
  FeatureType *pFVar10;
  ArrayFeatureType *this;
  StringFeatureType *this_00;
  ostream *poVar11;
  long lVar12;
  long *plVar13;
  long lVar14;
  NetworkUpdateParameters *pNVar15;
  void **ppvVar16;
  Model spec;
  string target;
  FeatureDescription feature;
  Result res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  TensorAttributes tensorAttributesIn;
  string labels [4];
  LogFinisher local_1c9;
  Model local_1c8;
  string local_198;
  vector<long,_std::allocator<long>_> local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140 [2];
  _func_int **local_120;
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  TensorAttributes local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  CoreML::Specification::Model::Model(&local_1c8);
  CoreML::Result::Result((Result *)&local_120);
  local_c8.name._0_4_ = 0x3278c5;
  local_c8.name._4_4_ = 0;
  local_c8.dimension = 3;
  local_c8._12_4_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"2","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"3","");
  plVar13 = local_48;
  local_58[0] = plVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
             &local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 2),
             (allocator_type *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,&local_e0);
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel(&local_1c8,true,&local_c8,&local_f8,&local_178,true);
  if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  local_1c8.specificationversion_ = 4;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_1c8.description_ = pMVar7;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  pMVar7 = local_1c8.description_;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar2 = (pMVar7->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar16 = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    ppvVar16 = (void **)0x0;
  }
  lVar14 = (long)(pMVar7->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar14 != 0) {
    lVar12 = 0;
    do {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)local_158,*(FeatureDescription **)((long)ppvVar16 + lVar12));
      if (local_1c8.description_ == (ModelDescription *)0x0) {
        pMVar7 = (ModelDescription *)operator_new(0x78);
        CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
        local_1c8.description_ = pMVar7;
      }
      pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                          (Type *)0x0);
      CoreML::Specification::FeatureDescription::CopyFrom(pTVar8,(FeatureDescription *)local_158);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)local_158);
      lVar12 = lVar12 + 8;
    } while (lVar14 * 8 != lVar12);
  }
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_1c8.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  if (local_1c8._oneof_case_[0] != 0x193) {
    local_1c8.Type_.neuralnetworkclassifier_ =
         CoreML::Specification::NeuralNetworkClassifier::default_instance();
  }
  pNVar15 = (local_1c8.Type_.neuralnetworkclassifier_)->updateparams_;
  if (pNVar15 == (NetworkUpdateParameters *)0x0) {
    pNVar15 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if ((pNVar15->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_158,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5c6);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_158,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_1c9,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_158);
  }
  pvVar3 = ((pNVar15->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if (*(int *)((long)pvVar3 + 0x24) == 10) {
    pCVar9 = *(CategoricalCrossEntropyLossLayer **)((long)pvVar3 + 0x18);
  }
  else {
    pCVar9 = CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
  }
  psVar4 = (pCVar9->target_).ptr_;
  pcVar5 = (psVar4->_M_dataplus)._M_p;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar5,pcVar5 + psVar4->_M_string_length);
  psVar4 = (pTVar8->name_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar8->name_,&local_198);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  pFVar10 = pTVar8->type_;
  if (pFVar10 == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar8->type_ = pFVar10;
  }
  if (pFVar10->_oneof_case_[0] == 5) {
    this = (pFVar10->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 5;
    this = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this);
    (pFVar10->Type_).multiarraytype_ = this;
  }
  this->datatype_ = 0x20020;
  iVar1 = (this->shape_).current_size_;
  if (iVar1 == (this->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this->shape_,iVar1 + 1);
    iVar1 = (this->shape_).current_size_;
  }
  (this->shape_).current_size_ = iVar1 + 1;
  ((this->shape_).rep_)->elements[iVar1] = 1;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_1c8.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  pMVar7 = local_1c8.description_;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  psVar4 = (pTVar8->name_).ptr_;
  if (psVar4 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
              (&pTVar8->name_,(pMVar7->predictedfeaturename_).ptr_);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar4);
  }
  pFVar10 = pTVar8->type_;
  if (pFVar10 == (FeatureType *)0x0) {
    pFVar10 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar10);
    pTVar8->type_ = pFVar10;
  }
  if (pFVar10->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar10);
    pFVar10->_oneof_case_[0] = 3;
    this_00 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(this_00);
    (pFVar10->Type_).stringtype_ = this_00;
  }
  CoreML::Model::validate((Result *)local_158,&local_1c8);
  local_120 = (_func_int **)local_158;
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != local_140) {
    operator_delete(local_150._M_p,(ulong)(local_140[0]._M_allocated_capacity + 1));
  }
  bVar6 = CoreML::Result::good((Result *)&local_120);
  if (!bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x7c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar11 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x91c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar11 + -0x18) + (char)poVar11);
    std::ostream::put((char)poVar11);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  lVar14 = -0x80;
  do {
    if (plVar13 != (long *)plVar13[-2]) {
      operator_delete((long *)plVar13[-2],*plVar13 + 1);
    }
    plVar13 = plVar13 + -4;
    lVar14 = lVar14 + 0x20;
  } while (lVar14 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1c8);
  return (uint)!bVar6;
}

Assistant:

int testValid_Classifier_PredictedFeatureNameAndTarget() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target + predicted feature nmae to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    auto trainingInput2 = spec.mutable_description()->mutable_traininginput()->Add();
    trainingInput2->set_name(spec.description().predictedfeaturename());
    trainingInput2->mutable_type()->mutable_stringtype();

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}